

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O2

string * __thiscall
IRT::TreePattern::GetStringRepresentation_abi_cxx11_
          (string *__return_storage_ptr__,TreePattern *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->stringRepresentation);
  return __return_storage_ptr__;
}

Assistant:

std::string IRT::TreePattern::GetStringRepresentation( ) {
    return stringRepresentation;
}